

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrBindingModificationsKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrBindingModificationBaseHeaderKHR *value_01;
  XrStructureType __val;
  uint uVar6;
  char cVar7;
  bool bVar8;
  char cVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  string type_prefix;
  string bindingmodifications_prefix;
  string next_prefix;
  string bindingmodificationcount_prefix;
  string bindingmodifications_array_prefix;
  ostringstream oss_bindingModificationCount;
  string __str_1;
  ostringstream oss_bindingModifications_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  long *local_580;
  long local_578;
  long local_570 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  XrGeneratedDispatchTable *local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  string local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_498.field_2;
  local_5a8 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  local_498._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_498._M_dataplus._M_p + (local_498._M_string_length - 1);
  lVar14 = 0;
  do {
    bVar2 = local_1a8[lVar14];
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar14 = lVar14 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar14 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            (local_5a8,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5c8);
  local_540 = gen_dispatch_table;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar17 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar16 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar17 = uVar6;
        uVar13 = (uint)uVar16;
        if (uVar13 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_001656c4;
        }
        if (uVar13 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_001656c4;
        }
        if (uVar13 < 10000) goto LAB_001656c4;
        uVar16 = uVar16 / 10000;
        uVar6 = uVar17 + 4;
      } while (99999 < uVar13);
      uVar17 = uVar17 + 1;
    }
LAB_001656c4:
    local_498._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar17 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar3 >> 0x1f),uVar17,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_5a8,(char (*) [16])"XrStructureType",&local_5c8,&local_498);
    gen_dispatch_table = local_540;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != paVar1) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar11,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              (local_5a8,(char (*) [16])"XrStructureType",&local_5c8,(char (*) [64])&local_498);
  }
  local_580 = local_570;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_580);
  value_00 = value->next;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,local_580,local_578 + (long)local_580);
  bVar8 = ApiDumpDecodeNextChain
                    (gen_dispatch_table,value_00,&local_4b8,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_560,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_560);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"0x",2);
  *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (local_5a8,(char (*) [9])"uint32_t",&local_560,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrBindingModificationsKHR *)local_1a8._0_8_ !=
      (XrBindingModificationsKHR *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[49],std::__cxx11::string&,std::__cxx11::string>
            (local_5a8,(char (*) [49])"const XrBindingModificationBaseHeaderKHR* const*",&local_5a0,
             local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (value->bindingModificationCount != 0) {
    uVar16 = 0;
    do {
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,local_5a0._M_dataplus._M_p,
                 local_5a0._M_dataplus._M_p + local_5a0._M_string_length);
      std::__cxx11::string::append((char *)&local_538);
      cVar9 = '\x01';
      if (9 < uVar16) {
        uVar15 = uVar16;
        cVar7 = '\x04';
        do {
          cVar9 = cVar7;
          uVar17 = (uint)uVar15;
          if (uVar17 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_00165a28;
          }
          if (uVar17 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_00165a28;
          }
          if (uVar17 < 10000) goto LAB_00165a28;
          uVar15 = (uVar15 & 0xffffffff) / 10000;
          cVar7 = cVar9 + '\x04';
        } while (99999 < uVar17);
        cVar9 = cVar9 + '\x01';
      }
LAB_00165a28:
      local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
      std::__cxx11::string::_M_construct((ulong)local_320,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_320[0]._M_dataplus._M_p,(uint)local_320[0]._M_string_length,(uint)uVar16);
      std::__cxx11::string::_M_append((char *)&local_538,(ulong)local_320[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
        operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::string::append((char *)&local_538);
      value_01 = value->bindingModifications[uVar16];
      if (value_01 == (XrBindingModificationBaseHeaderKHR *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8
                 ) = *(uint *)((long)&local_320[0].field_2 +
                              *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8
        ;
        std::ostream::_M_insert<void_const*>(local_320);
        std::__cxx11::stringbuf::str();
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[49],std::__cxx11::string&,std::__cxx11::string>
                  (local_5a8,(char (*) [49])"const XrBindingModificationBaseHeaderKHR* const*",
                   &local_538,&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
      }
      else {
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,local_538._M_dataplus._M_p,
                   local_538._M_dataplus._M_p + local_538._M_string_length);
        local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4f8,"const XrBindingModificationBaseHeaderKHR* const*","");
        bVar8 = ApiDumpOutputXrStruct
                          (local_540,value_01,&local_518,&local_4f8,true,
                           (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
          __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < value->bindingModificationCount);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (local_580 != local_570) {
    operator_delete(local_580,local_570[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrBindingModificationsKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string bindingmodificationcount_prefix = prefix;
        bindingmodificationcount_prefix += "bindingModificationCount";
        std::ostringstream oss_bindingModificationCount;
        oss_bindingModificationCount << "0x" << std::hex << (value->bindingModificationCount);
        contents.emplace_back("uint32_t", bindingmodificationcount_prefix, oss_bindingModificationCount.str());
        std::string bindingmodifications_prefix = prefix;
        bindingmodifications_prefix += "bindingModifications";
        std::ostringstream oss_bindingModifications_array;
        oss_bindingModifications_array << std::hex << reinterpret_cast<const void*>(value->bindingModifications);
        contents.emplace_back("const XrBindingModificationBaseHeaderKHR* const*", bindingmodifications_prefix, oss_bindingModifications_array.str());
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            std::string bindingmodifications_array_prefix = bindingmodifications_prefix;
            bindingmodifications_array_prefix += "[";
            bindingmodifications_array_prefix += std::to_string(value_bindingmodifications_inc);
            bindingmodifications_array_prefix += "]";
            if (nullptr == value->bindingModifications[value_bindingmodifications_inc]) {
                std::ostringstream oss_bindingModifications;
                oss_bindingModifications << std::hex << reinterpret_cast<const void*>(value->bindingModifications[value_bindingmodifications_inc]);
                contents.emplace_back("const XrBindingModificationBaseHeaderKHR* const*", bindingmodifications_array_prefix, oss_bindingModifications.str());
            } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->bindingModifications[value_bindingmodifications_inc], bindingmodifications_array_prefix, "const XrBindingModificationBaseHeaderKHR* const*", true, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}